

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O3

int Dau_DsdDecomposeTripleVars(Dau_Dsd_t *p,word *pTruth,int *pVars,int nVars)

{
  undefined4 *puVar1;
  uint *puVar2;
  char acVar3 [8];
  ulong uVar4;
  undefined4 uVar5;
  word wVar6;
  int iVar7;
  uint uVar8;
  uint jVar;
  uint jVar_00;
  int iVar9;
  uint uVar10;
  uint uVar11;
  word *pLimit;
  size_t sVar13;
  byte bVar14;
  byte bVar16;
  byte bVar17;
  uint uVar18;
  int iVar19;
  undefined1 *puVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  long lVar25;
  char (*pacVar26) [32];
  int iVar27;
  int iVar28;
  ulong *puVar29;
  char (*pacVar30) [8];
  ulong *puVar31;
  char *pcVar32;
  word *pwVar33;
  ulong *puVar34;
  Dau_Dsd_t *pDVar35;
  char *pcVar36;
  word *pwVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  uint uSupports;
  uint uVar42;
  bool bVar43;
  bool bVar44;
  undefined1 auVar45 [16];
  uint uVar46;
  uint uVar47;
  undefined1 auVar48 [16];
  word *pLimit_3;
  word *pLimit_5;
  word *pLimit_1;
  word pTtCof [2] [64];
  timespec ts;
  long local_11c8;
  char local_1142 [10];
  int local_1138;
  undefined4 uStack_1134;
  undefined4 uStack_1130;
  undefined4 uStack_112c;
  ulong local_1128 [64];
  ulong local_f28 [64];
  Dau_Dsd_t local_d28;
  ulong uVar12;
  byte bVar15;
  
  uVar23 = (ulong)(uint)nVars;
  iVar7 = clock_gettime(3,(timespec *)&local_d28);
  if (iVar7 < 0) {
    local_11c8 = 1;
  }
  else {
    lVar25 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                    SEXT816(CONCAT44(local_d28.nSizeNonDec,local_d28.nPos)),8);
    local_11c8 = ((lVar25 >> 7) - (lVar25 >> 0x3f)) + local_d28._0_8_ * -1000000;
  }
  local_1138 = -0x80000000;
  uStack_1134 = 0x80000000;
  uStack_1130 = 0x80000000;
  uStack_112c = 0x80000000;
  auVar48 = _DAT_0083bbc0;
  while (uVar11 = (uint)uVar23, uVar38 = uVar23, (int)uVar11 < 1) {
LAB_004a3162:
    if ((int)uVar38 == 0) {
      iVar7 = clock_gettime(3,(timespec *)&local_d28);
      if (iVar7 < 0) {
        lVar25 = -1;
      }
      else {
        lVar25 = CONCAT44(local_d28.nSizeNonDec,local_d28.nPos) / 1000 + local_d28._0_8_ * 1000000;
      }
      s_Times_2 = s_Times_2 + lVar25 + local_11c8;
      return (int)uVar23;
    }
  }
  iVar7 = uVar11 - 6;
  uVar8 = 1 << ((byte)iVar7 & 0x1f);
  uVar24 = uVar8;
  if (uVar11 < 7) {
    uVar24 = 1;
  }
  uVar40 = (ulong)uVar24;
  puVar34 = local_f28 + (int)uVar24;
  jVar = uVar11 - 1;
  uVar12 = (ulong)jVar;
  jVar_00 = uVar11 - 2;
LAB_004a26c4:
  uVar39 = uVar38 - 1;
  bVar16 = 0;
  uVar41 = 0;
  uVar42 = 0;
  do {
    if (uVar39 != uVar41) {
      iVar9 = Dau_DsdFindSupportOne(p,pTruth,pVars,uVar11,(int)uVar39,(int)uVar41);
      uVar42 = uVar42 | iVar9 << (bVar16 & 0x1f);
      auVar48 = _DAT_0083bbc0;
    }
    uVar41 = uVar41 + 1;
    bVar16 = bVar16 + 2;
  } while (uVar11 != (uint)uVar41);
  if ((uVar42 & 0x55555555 & uVar42 >> 1) == 0) {
    local_d28.fSplitPrime = 0;
    local_d28.fWriteTruth = p->fWriteTruth;
    iVar9 = pVars[uVar39 & 0xffffffff];
    pVars[uVar39 & 0xffffffff] = pVars[uVar12];
    pVars[uVar12] = iVar9;
    Abc_TtSwapVars(pTruth,uVar11,(int)uVar39,jVar);
    if (uVar11 < 7) {
      local_1128[0] = s_Truths6Neg[uVar12] & *pTruth;
      bVar16 = (byte)(1 << ((byte)jVar & 0x1f));
      local_1128[0] = local_1128[0] << (bVar16 & 0x3f) | local_1128[0];
      local_f28[0] = *pTruth & s_Truths6[uVar12];
      local_f28[0] = local_f28[0] >> (bVar16 & 0x3f) | local_f28[0];
    }
    else if (iVar7 != 0x1f) {
      iVar9 = uVar11 - 7;
      bVar16 = (byte)iVar9;
      uVar24 = 1 << (bVar16 & 0x1f);
      iVar27 = 2 << (bVar16 & 0x1f);
      uVar23 = 1;
      if (1 < (int)uVar24) {
        uVar23 = (ulong)uVar24;
      }
      puVar31 = local_1128 + (int)uVar24;
      puVar34 = local_1128;
      pwVar33 = pTruth;
      do {
        if (iVar9 != 0x1f) {
          uVar38 = 0;
          do {
            uVar40 = pwVar33[uVar38];
            puVar34[uVar38] = uVar40;
            puVar31[uVar38] = uVar40;
            uVar38 = uVar38 + 1;
          } while (uVar23 != uVar38);
        }
        pwVar33 = pwVar33 + iVar27;
        puVar31 = puVar31 + iVar27;
        puVar34 = puVar34 + iVar27;
      } while (pwVar33 < pTruth + (int)uVar8);
      puVar34 = local_f28;
      if (iVar7 != 0x1f) {
        uVar24 = 1 << (bVar16 & 0x1f);
        iVar7 = 2 << (bVar16 & 0x1f);
        uVar23 = 1;
        if (1 < (int)uVar24) {
          uVar23 = (ulong)uVar24;
        }
        pwVar33 = pTruth;
        do {
          uVar38 = uVar23;
          pwVar37 = pwVar33;
          puVar31 = puVar34;
          if (iVar9 != 0x1f) {
            do {
              uVar40 = pwVar37[(int)uVar24];
              *puVar31 = uVar40;
              puVar31[(int)uVar24] = uVar40;
              uVar38 = uVar38 - 1;
              pwVar37 = pwVar37 + 1;
              puVar31 = puVar31 + 1;
            } while (uVar38 != 0);
          }
          pwVar33 = pwVar33 + iVar7;
          puVar34 = puVar34 + iVar7;
        } while (pwVar33 < pTruth + (int)uVar8);
      }
    }
    iVar7 = p->nPos;
    p->nPos = iVar7 + 1;
    p->pOutput[iVar7] = '<';
    Dau_DsdWriteVar(p,pVars[uVar12],0);
    Dau_DsdDecomposeInt(&local_d28,local_f28,jVar);
    if (local_d28.pOutput[0] != 0) {
      pcVar32 = local_d28.pOutput;
      bVar16 = local_d28.pOutput[0];
      do {
        pcVar32 = pcVar32 + 1;
        if (((char)bVar16 < 'a') || ((int)(uVar11 + 0x60) <= (int)(uint)bVar16)) {
          iVar7 = p->nPos;
          p->nPos = iVar7 + 1;
          p->pOutput[iVar7] = bVar16;
        }
        else {
          Dau_DsdWriteVar(p,pVars[(ulong)bVar16 - 0x61],0);
        }
        bVar16 = *pcVar32;
      } while (bVar16 != 0);
    }
    p->nSizeNonDec = local_d28.nSizeNonDec;
    if (local_d28.nSizeNonDec != 0) {
      uVar24 = 1 << ((char)local_d28.nSizeNonDec - 6U & 0x1f);
      if (local_d28.nSizeNonDec < 7) {
        uVar24 = 1;
      }
      if (0 < (int)uVar24) {
        uVar23 = 0;
        do {
          pTruth[uVar23] = local_f28[uVar23];
          uVar23 = uVar23 + 1;
        } while (uVar24 != uVar23);
      }
    }
    Dau_DsdDecomposeInt(&local_d28,local_1128,jVar);
    if (local_d28.pOutput[0] != 0) {
      pcVar32 = local_d28.pOutput;
      do {
        pcVar32 = pcVar32 + 1;
        if ((local_d28.pOutput[0] < 'a') ||
           ((int)(uVar11 + 0x60) <= (int)(uint)(byte)local_d28.pOutput[0])) {
          iVar7 = p->nPos;
          p->nPos = iVar7 + 1;
          p->pOutput[iVar7] = local_d28.pOutput[0];
        }
        else {
          Dau_DsdWriteVar(p,pVars[(ulong)(byte)local_d28.pOutput[0] - 0x61],0);
        }
        local_d28.pOutput[0] = *pcVar32;
      } while (local_d28.pOutput[0] != 0);
    }
    iVar7 = p->nPos;
    p->nPos = iVar7 + 1;
    p->pOutput[iVar7] = '>';
    iVar7 = p->nSizeNonDec;
    if (p->nSizeNonDec <= local_d28.nSizeNonDec) {
      iVar7 = local_d28.nSizeNonDec;
    }
    p->nSizeNonDec = iVar7;
    if (local_d28.nSizeNonDec != 0) {
      uVar11 = 1 << ((char)local_d28.nSizeNonDec - 6U & 0x1f);
      if (local_d28.nSizeNonDec < 7) {
        uVar11 = 1;
      }
      if (0 < (int)uVar11) {
        memcpy(pTruth,local_1128,(ulong)uVar11 << 3);
      }
    }
    return 0;
  }
  uVar18 = uVar42 & 0x55555555 & ~uVar42 >> 1;
  if ((uVar18 - 1 < (uVar18 ^ uVar18 - 1)) &&
     (uVar42 = ~uVar42 & uVar42 >> 1 & 0x55555555, uVar42 - 1 < (uVar42 ^ uVar42 - 1))) {
    if (uVar18 == 0) {
LAB_004a35e2:
      __assert_fail("Supp > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                    ,0x3eb,"int Abc_TtSuppFindFirst(int)");
    }
    uVar10 = 0;
    do {
      if ((uVar18 >> (uVar10 & 0x1f) & 1) != 0) goto LAB_004a2781;
      uVar10 = uVar10 + 1;
    } while (uVar10 != 0x20);
    uVar10 = 0xffffffff;
LAB_004a2781:
    if (uVar42 == 0) goto LAB_004a35e2;
    iVar9 = (int)uVar10 >> 1;
    uVar18 = 0;
    do {
      if ((uVar42 >> (uVar18 & 0x1f) & 1) != 0) goto LAB_004a27a0;
      uVar18 = uVar18 + 1;
    } while (uVar18 != 0x20);
    uVar18 = 0xffffffff;
LAB_004a27a0:
    iVar27 = (int)uVar18 >> 1;
    bVar14 = (byte)iVar9;
    bVar15 = (byte)iVar27;
    bVar16 = (byte)uVar39;
    if (uVar24 == 1) {
      local_1128[0] = s_Truths6Neg[uVar39] & *pTruth;
      bVar16 = (byte)(1 << (bVar16 & 0x1f));
      local_f28[0] = *pTruth & s_Truths6[uVar39];
      local_1128[0] = local_1128[0] << (bVar16 & 0x3f) | local_1128[0];
      local_f28[0] = local_f28[0] >> (bVar16 & 0x3f) | local_f28[0];
      bVar16 = (byte)(1 << (bVar14 & 0x1f));
      uVar41 = (s_Truths6Neg[iVar9] & local_1128[0]) << (bVar16 & 0x3f) |
               s_Truths6Neg[iVar9] & local_1128[0];
      local_d28.nVarsInit = (int)uVar41;
      local_d28.nVarsUsed = (int)(uVar41 >> 0x20);
      uVar41 = (local_1128[0] & s_Truths6[iVar9]) >> (bVar16 & 0x3f) |
               local_1128[0] & s_Truths6[iVar9];
      bVar16 = (byte)(1 << (bVar15 & 0x1f));
      local_d28.Cache[6][0x18] = (char)uVar41;
      local_d28.Cache[6][0x19] = (char)(uVar41 >> 8);
      local_d28.Cache[6][0x1a] = (char)(uVar41 >> 0x10);
      local_d28.Cache[6][0x1b] = (char)(uVar41 >> 0x18);
      local_d28.Cache[6][0x1c] = (char)(uVar41 >> 0x20);
      local_d28.Cache[6][0x1d] = (char)(uVar41 >> 0x28);
      local_d28.Cache[6][0x1e] = (char)(uVar41 >> 0x30);
      local_d28.Cache[6][0x1f] = (char)(uVar41 >> 0x38);
      uVar41 = (s_Truths6Neg[iVar27] & local_f28[0]) << (bVar16 & 0x3f) |
               s_Truths6Neg[iVar27] & local_f28[0];
      local_d28.Cache[0x16][0x18] = (char)uVar41;
      local_d28.Cache[0x16][0x19] = (char)(uVar41 >> 8);
      local_d28.Cache[0x16][0x1a] = (char)(uVar41 >> 0x10);
      local_d28.Cache[0x16][0x1b] = (char)(uVar41 >> 0x18);
      local_d28.Cache[0x16][0x1c] = (char)(uVar41 >> 0x20);
      local_d28.Cache[0x16][0x1d] = (char)(uVar41 >> 0x28);
      local_d28.Cache[0x16][0x1e] = (char)(uVar41 >> 0x30);
      local_d28.Cache[0x16][0x1f] = (char)(uVar41 >> 0x38);
      uVar41 = (local_f28[0] & s_Truths6[iVar27]) >> (bVar16 & 0x3f) |
               local_f28[0] & s_Truths6[iVar27];
      local_d28.pOutput[0xd8] = (char)uVar41;
      local_d28.pOutput[0xd9] = (char)(uVar41 >> 8);
      local_d28.pOutput[0xda] = (char)(uVar41 >> 0x10);
      local_d28.pOutput[0xdb] = (char)(uVar41 >> 0x18);
      local_d28.pOutput[0xdc] = (char)(uVar41 >> 0x20);
      local_d28.pOutput[0xdd] = (char)(uVar41 >> 0x28);
      local_d28.pOutput[0xde] = (char)(uVar41 >> 0x30);
      local_d28.pOutput[0xdf] = (char)(uVar41 >> 0x38);
LAB_004a287c:
      uVar41 = 0;
      do {
        if (local_d28.pVarDefs[uVar41 - 5] !=
            *(char (*) [8])(local_d28.Cache[0x16] + uVar41 * 8 + 0x18)) {
          bVar43 = false;
          goto LAB_004a2924;
        }
        uVar41 = uVar41 + 1;
      } while (uVar40 != uVar41);
      lVar25 = 0;
      do {
        bVar43 = *(long *)(local_d28.Cache[6] + lVar25 * 8 + 0x18) ==
                 *(long *)(local_d28.pOutput + lVar25 * 8 + 0xd8);
        if (!bVar43) break;
        bVar44 = uVar40 - 1 != lVar25;
        lVar25 = lVar25 + 1;
      } while (bVar44);
LAB_004a2924:
      uVar41 = 0;
      do {
        if (local_d28.pVarDefs[uVar41 - 5] != *(char (*) [8])(local_d28.pOutput + uVar41 * 8 + 0xd8)
           ) goto LAB_004a296e;
        uVar41 = uVar41 + 1;
      } while (uVar40 != uVar41);
      uVar41 = 0;
      do {
        if (*(long *)(local_d28.Cache[6] + uVar41 * 8 + 0x18) !=
            *(long *)(local_d28.Cache[0x16] + uVar41 * 8 + 0x18)) goto LAB_004a296e;
        uVar41 = uVar41 + 1;
      } while (uVar40 != uVar41);
      bVar44 = true;
      pcVar32 = "!";
    }
    else {
      if ((long)uVar38 < 7) {
        if (0 < (int)uVar24) {
          uVar41 = s_Truths6Neg[uVar39];
          uVar22 = 0;
          do {
            local_1128[uVar22] =
                 (pTruth[uVar22] & uVar41) << ((byte)(1 << (bVar16 & 0x1f)) & 0x3f) |
                 pTruth[uVar22] & uVar41;
            uVar22 = uVar22 + 1;
          } while (uVar40 != uVar22);
LAB_004a2a06:
          if ((long)uVar38 < 7) {
            if (0 < (int)uVar24) {
              uVar41 = s_Truths6[uVar39];
              uVar22 = 0;
              do {
                local_f28[uVar22] =
                     (pTruth[uVar22] & uVar41) >> ((byte)(1 << (bVar16 & 0x1f)) & 0x3f) |
                     pTruth[uVar22] & uVar41;
                uVar22 = uVar22 + 1;
              } while (uVar40 != uVar22);
            }
          }
          else if (0 < (int)uVar24) {
            iVar19 = (int)uVar38 + -7;
            bVar16 = (byte)iVar19;
            uVar42 = 1 << (bVar16 & 0x1f);
            iVar28 = 2 << (bVar16 & 0x1f);
            uVar41 = 1;
            if (1 < (int)uVar42) {
              uVar41 = (ulong)uVar42;
            }
            pwVar33 = pTruth;
            puVar31 = local_f28;
            do {
              pwVar37 = pwVar33;
              puVar29 = puVar31;
              uVar22 = uVar41;
              if (iVar19 != 0x1f) {
                do {
                  uVar4 = pwVar37[(int)uVar42];
                  *puVar29 = uVar4;
                  puVar29[(int)uVar42] = uVar4;
                  uVar22 = uVar22 - 1;
                  pwVar37 = pwVar37 + 1;
                  puVar29 = puVar29 + 1;
                } while (uVar22 != 0);
              }
              pwVar33 = pwVar33 + iVar28;
              puVar31 = puVar31 + iVar28;
            } while (pwVar33 < pTruth + (int)uVar24);
          }
        }
      }
      else if (0 < (int)uVar24) {
        iVar19 = (int)uVar38 + -7;
        bVar17 = (byte)iVar19;
        uVar42 = 1 << (bVar17 & 0x1f);
        iVar28 = 2 << (bVar17 & 0x1f);
        uVar41 = 1;
        if (1 < (int)uVar42) {
          uVar41 = (ulong)uVar42;
        }
        puVar29 = local_1128 + (int)uVar42;
        puVar31 = local_1128;
        pwVar33 = pTruth;
        do {
          if (iVar19 != 0x1f) {
            uVar22 = 0;
            do {
              uVar4 = pwVar33[uVar22];
              puVar31[uVar22] = uVar4;
              puVar29[uVar22] = uVar4;
              uVar22 = uVar22 + 1;
            } while (uVar41 != uVar22);
          }
          pwVar33 = pwVar33 + iVar28;
          puVar29 = puVar29 + iVar28;
          puVar31 = puVar31 + iVar28;
        } while (pwVar33 < pTruth + (int)uVar24);
        goto LAB_004a2a06;
      }
      if (iVar9 < 6) {
        if (0 < (int)uVar24) {
          uVar41 = s_Truths6Neg[iVar9];
          uVar22 = 0;
          do {
            local_d28.pVarDefs[uVar22 - 5] =
                 (char  [8])
                 ((local_1128[uVar22] & uVar41) << ((byte)(1 << (bVar14 & 0x1f)) & 0x3f) |
                 local_1128[uVar22] & uVar41);
            uVar22 = uVar22 + 1;
          } while (uVar40 != uVar22);
LAB_004a2b93:
          if (iVar9 < 6) {
            if (0 < (int)uVar24) {
              uVar41 = s_Truths6[iVar9];
              uVar22 = 0;
              do {
                *(ulong *)(local_d28.Cache[6] + uVar22 * 8 + 0x18) =
                     (local_1128[uVar22] & uVar41) >> ((byte)(1 << (bVar14 & 0x1f)) & 0x3f) |
                     local_1128[uVar22] & uVar41;
                uVar22 = uVar22 + 1;
              } while (uVar40 != uVar22);
            }
          }
          else if (0 < (int)uVar24) {
            bVar16 = (byte)(iVar9 + -6);
            uVar42 = 1 << (bVar16 & 0x1f);
            uVar41 = 1;
            if (1 < (int)uVar42) {
              uVar41 = (ulong)uVar42;
            }
            lVar25 = (long)(2 << (bVar16 & 0x1f));
            puVar31 = local_1128;
            pcVar32 = local_d28.Cache[6] + 0x18;
            do {
              puVar29 = puVar31;
              pcVar36 = pcVar32;
              uVar22 = uVar41;
              if (iVar9 + -6 != 0x1f) {
                do {
                  uVar4 = puVar29[(int)uVar42];
                  *(ulong *)pcVar36 = uVar4;
                  *(ulong *)(pcVar36 + (long)(int)uVar42 * 8) = uVar4;
                  uVar22 = uVar22 - 1;
                  puVar29 = puVar29 + 1;
                  pcVar36 = pcVar36 + 8;
                } while (uVar22 != 0);
              }
              puVar31 = puVar31 + lVar25;
              pcVar32 = pcVar32 + lVar25 * 8;
            } while (puVar31 < local_1128 + (int)uVar24);
          }
        }
      }
      else if (0 < (int)uVar24) {
        bVar16 = (byte)(iVar9 + -6);
        uVar42 = 1 << (bVar16 & 0x1f);
        lVar25 = (long)(2 << (bVar16 & 0x1f));
        uVar41 = 1;
        if (1 < (int)uVar42) {
          uVar41 = (ulong)uVar42;
        }
        pacVar30 = local_d28.pVarDefs + (long)(int)uVar42 + -5;
        puVar31 = local_1128;
        pDVar35 = &local_d28;
        do {
          if (iVar9 + -6 != 0x1f) {
            uVar22 = 0;
            do {
              acVar3 = *(char (*) [8])(puVar31 + uVar22);
              pDVar35->pVarDefs[uVar22 - 5] = acVar3;
              pacVar30[uVar22] = acVar3;
              uVar22 = uVar22 + 1;
            } while (uVar41 != uVar22);
          }
          puVar31 = puVar31 + lVar25;
          pacVar30 = pacVar30 + lVar25;
          pDVar35 = (Dau_Dsd_t *)(pDVar35->pVarDefs + lVar25 + -5);
        } while (puVar31 < local_1128 + (int)uVar24);
        goto LAB_004a2b93;
      }
      if (iVar27 < 6) {
        if (0 < (int)uVar24) {
          uVar41 = s_Truths6Neg[iVar27];
          uVar22 = 0;
          do {
            *(ulong *)(local_d28.Cache[0x16] + uVar22 * 8 + 0x18) =
                 (local_f28[uVar22] & uVar41) << ((byte)(1 << (bVar15 & 0x1f)) & 0x3f) |
                 local_f28[uVar22] & uVar41;
            uVar22 = uVar22 + 1;
          } while (uVar40 != uVar22);
LAB_004a2d23:
          if (iVar27 < 6) {
            if (0 < (int)uVar24) {
              uVar41 = s_Truths6[iVar27];
              uVar22 = 0;
              do {
                *(ulong *)(local_d28.pOutput + uVar22 * 8 + 0xd8) =
                     (local_f28[uVar22] & uVar41) >> ((byte)(1 << (bVar15 & 0x1f)) & 0x3f) |
                     local_f28[uVar22] & uVar41;
                uVar22 = uVar22 + 1;
              } while (uVar40 != uVar22);
LAB_004a2df7:
              if (0 < (int)uVar24) goto LAB_004a287c;
              bVar44 = false;
              pcVar32 = "!";
              goto LAB_004a2e31;
            }
          }
          else if (0 < (int)uVar24) {
            bVar16 = (byte)(iVar27 + -6);
            uVar42 = 1 << (bVar16 & 0x1f);
            uVar41 = 1;
            if (1 < (int)uVar42) {
              uVar41 = (ulong)uVar42;
            }
            lVar25 = (long)(2 << (bVar16 & 0x1f));
            pcVar32 = local_d28.pOutput + 0xd8;
            puVar31 = local_f28;
            do {
              puVar29 = puVar31;
              pcVar36 = pcVar32;
              uVar22 = uVar41;
              if (iVar27 + -6 != 0x1f) {
                do {
                  uVar4 = puVar29[(int)uVar42];
                  *(ulong *)pcVar36 = uVar4;
                  *(ulong *)(pcVar36 + (long)(int)uVar42 * 8) = uVar4;
                  uVar22 = uVar22 - 1;
                  puVar29 = puVar29 + 1;
                  pcVar36 = pcVar36 + 8;
                } while (uVar22 != 0);
              }
              puVar31 = puVar31 + lVar25;
              pcVar32 = pcVar32 + lVar25 * 8;
            } while (puVar31 < puVar34);
            goto LAB_004a2df7;
          }
        }
      }
      else if (0 < (int)uVar24) {
        bVar16 = (byte)(iVar27 + -6);
        uVar42 = 1 << (bVar16 & 0x1f);
        lVar25 = (long)(2 << (bVar16 & 0x1f));
        uVar41 = 1;
        if (1 < (int)uVar42) {
          uVar41 = (ulong)uVar42;
        }
        pcVar36 = local_d28.Cache[0x16] + 0x18;
        pcVar32 = pcVar36 + (long)(int)uVar42 * 8;
        puVar31 = local_f28;
        do {
          if (iVar27 + -6 != 0x1f) {
            uVar22 = 0;
            do {
              uVar4 = puVar31[uVar22];
              *(ulong *)(pcVar36 + uVar22 * 8) = uVar4;
              *(ulong *)(pcVar32 + uVar22 * 8) = uVar4;
              uVar22 = uVar22 + 1;
            } while (uVar41 != uVar22);
          }
          puVar31 = puVar31 + lVar25;
          pcVar32 = pcVar32 + lVar25 * 8;
          pcVar36 = pcVar36 + lVar25 * 8;
        } while (puVar31 < puVar34);
        goto LAB_004a2d23;
      }
      bVar44 = false;
      pcVar32 = "!";
    }
    goto LAB_004a2e31;
  }
  goto LAB_004a3148;
LAB_004a296e:
  bVar44 = true;
  pcVar32 = "";
  if (!bVar43) {
LAB_004a3148:
    bVar44 = (long)uVar38 < 2;
    uVar38 = uVar39;
    if (bVar44) goto LAB_004a3162;
    goto LAB_004a26c4;
  }
LAB_004a2e31:
  iVar9 = pVars[iVar9];
  if (Dau_DsdTtElems_pTtElems == 0) {
    lVar25 = 1;
    puVar20 = Dau_DsdTtElems_TtElems;
    auVar45 = _DAT_007ee2d0;
    do {
      if (SUB164(auVar45 ^ _DAT_007ee2e0,4) == local_1138 &&
          SUB164(auVar45 ^ _DAT_007ee2e0,0) < -0x7ffffff3) {
        *(undefined1 **)(Dau_DsdTtElems_TtElems + lVar25 * 8 + 0x19f8) = puVar20;
        (&Dau_DsdTtElems_pTtElems)[lVar25] = (long)(puVar20 + 0x200);
      }
      lVar21 = auVar45._8_8_;
      auVar45._0_8_ = auVar45._0_8_ + 2;
      auVar45._8_8_ = lVar21 + 2;
      lVar25 = lVar25 + 2;
      puVar20 = puVar20 + 0x400;
    } while (lVar25 != 0xf);
    uVar41 = 0;
    do {
      lVar25 = (&Dau_DsdTtElems_pTtElems)[uVar41];
      if (uVar41 < 6) {
        wVar6 = s_Truths6[uVar41];
        uVar5 = *(undefined4 *)((long)s_Truths6 + uVar41 * 8 + 4);
        lVar21 = 0;
        do {
          puVar1 = (undefined4 *)(lVar25 + lVar21 * 8);
          *puVar1 = (int)wVar6;
          puVar1[1] = uVar5;
          puVar1[2] = (int)wVar6;
          puVar1[3] = uVar5;
          lVar21 = lVar21 + 2;
        } while (lVar21 != 0x40);
      }
      else {
        uVar42 = 1 << ((char)uVar41 - 6U & 0x1f);
        lVar21 = 0;
        uVar18 = 0;
        uVar10 = 1;
        do {
          uVar46 = uVar42 & uVar18;
          uVar47 = uVar42 & uVar10;
          puVar2 = (uint *)(lVar25 + lVar21 * 8);
          *puVar2 = -(uint)(uVar46 == 0) ^ 0xffffffff;
          puVar2[1] = -(uint)(uVar46 == 0) ^ 0xffffffff;
          puVar2[2] = -(uint)(uVar47 == 0) ^ 0xffffffff;
          puVar2[3] = -(uint)(uVar47 == 0) ^ 0xffffffff;
          lVar21 = lVar21 + 2;
          uVar18 = uVar18 + auVar48._0_4_;
          uVar10 = uVar10 + auVar48._4_4_;
        } while (lVar21 != 0x40);
      }
      uVar41 = uVar41 + 1;
    } while (uVar41 != 0xc);
  }
  if (bVar44) {
    lVar25 = (&Dau_DsdTtElems_pTtElems)[uVar39];
    uVar41 = 0;
    do {
      uVar22 = *(ulong *)(local_d28.Cache[0x16] + uVar41 * 8 + 0x18);
      pTruth[uVar41] =
           (*(ulong *)(local_d28.pOutput + uVar41 * 8 + 0xd8) ^ uVar22) &
           *(ulong *)(lVar25 + uVar41 * 8) ^ uVar22;
      uVar41 = uVar41 + 1;
    } while (uVar40 != uVar41);
  }
  sprintf(local_1142,"<%c%c%s%c>",(ulong)(pVars[uVar39] + 0x61),(ulong)(pVars[iVar27] + 0x61),
          pcVar32,(ulong)(iVar9 + 0x61));
  sVar13 = strlen(local_1142);
  if (7 < sVar13) {
    __assert_fail("strlen(pStr) < 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                  ,0x445,"int Dau_DsdAddVarDef(Dau_Dsd_t *, char *)");
  }
  uVar42 = p->nVarsUsed;
  uVar41 = (ulong)(int)uVar42;
  if (0x1f < (long)uVar41) {
    __assert_fail("p->nVarsUsed < 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                  ,0x446,"int Dau_DsdAddVarDef(Dau_Dsd_t *, char *)");
  }
  uVar22 = uVar41;
  if (0 < (int)uVar42) {
    lVar25 = 0;
    do {
      p->Cache[(int)uVar41][lVar25] = '\0';
      lVar25 = lVar25 + 1;
      uVar42 = p->nVarsUsed;
      uVar41 = (ulong)uVar42;
    } while (lVar25 < (int)uVar42);
    uVar22 = (long)(int)uVar42;
    if (0 < (int)uVar42) {
      lVar25 = 0;
      pacVar26 = p->Cache;
      do {
        (*pacVar26)[(int)uVar41] = '\0';
        lVar25 = lVar25 + 1;
        uVar42 = p->nVarsUsed;
        uVar41 = (ulong)uVar42;
        uVar22 = (ulong)(int)uVar42;
        pacVar26 = pacVar26 + 1;
      } while (lVar25 < (long)uVar22);
    }
  }
  p->nVarsUsed = uVar42 + 1;
  strcpy(p->pVarDefs[uVar22],local_1142);
  pVars[uVar39] = p->nVarsUsed + -1;
  iVar19 = pVars[iVar27];
  pVars[iVar27] = pVars[uVar12];
  pVars[uVar12] = iVar19;
  Abc_TtSwapVars(pTruth,uVar11,iVar27,jVar);
  if (uVar11 != 1) {
    lVar25 = 0;
    uVar41 = 0;
    while (pVars[uVar41] != iVar9) {
      uVar41 = uVar41 + 1;
      lVar25 = lVar25 + 0x100000000;
      if (uVar12 == uVar41) goto LAB_004a35c3;
    }
    iVar9 = *(int *)((long)pVars + (lVar25 >> 0x1e));
    *(int *)((long)pVars + (lVar25 >> 0x1e)) = pVars[(int)jVar_00];
    pVars[(int)jVar_00] = iVar9;
    Abc_TtSwapVars(pTruth,jVar,(int)uVar41,jVar_00);
    if (uVar11 != 2) {
      uVar41 = 0;
      while (pVars[uVar41] != p->nVarsUsed + -1) {
        uVar41 = uVar41 + 1;
        if (jVar_00 == uVar41) goto LAB_004a35c3;
      }
      iVar9 = Dau_DsdDecomposeSingleVarOne(p,pTruth,pVars,jVar_00,(int)uVar41);
      uVar42 = jVar_00;
      if ((iVar9 == 0) ||
         (uVar42 = Dau_DsdDecomposeSingleVar(p,pTruth,pVars,uVar11 - 3), auVar48 = _DAT_0083bbc0,
         uVar42 != uVar11)) {
        if ((uVar42 == 0) ||
           (uVar11 = Dau_DsdDecomposeDoubleVars(p,pTruth,pVars,uVar42), uVar11 == 0)) {
          iVar7 = clock_gettime(3,(timespec *)&local_d28);
          if (iVar7 < 0) {
            lVar25 = -1;
          }
          else {
            lVar25 = CONCAT44(local_d28.nSizeNonDec,local_d28.nPos) / 1000 +
                     local_d28._0_8_ * 1000000;
          }
          s_Times_2 = s_Times_2 + lVar25 + local_11c8;
          return 0;
        }
        uVar23 = (ulong)uVar11;
        auVar48 = _DAT_0083bbc0;
        goto LAB_004a3162;
      }
      goto LAB_004a3148;
    }
  }
LAB_004a35c3:
  __assert_fail("v < nVars",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                ,0x454,"int Dau_DsdFindVarDef(int *, int, int)");
}

Assistant:

int Dau_DsdDecomposeTripleVars( Dau_Dsd_t * p, word  * pTruth, int * pVars, int nVars )
{
    abctime clk = Abc_Clock();
    while ( 1 )
    {
        int v;
//        Kit_DsdPrintFromTruth( (unsigned *)pTruth, 6 ); printf( "\n" );
        for ( v = nVars - 1; v >= 0; v-- )
        {
            unsigned uSupports = Dau_DsdFindSupports( p, pTruth, pVars, nVars, v );
//            Dau_DsdPrintSupports( uSupports, nVars );
            if ( (uSupports & (uSupports >> 1) & 0x55555555) == 0 ) // non-overlapping supports
                return Dau_DsdDecomposeTripleVarsOuter( p, pTruth, pVars, nVars, v );
            if ( Abc_TtSuppOnlyOne( uSupports & (~uSupports >> 1) & 0x55555555) &&
                 Abc_TtSuppOnlyOne(~uSupports & ( uSupports >> 1) & 0x55555555) ) // one unique variable in each cofactor
            {
                int nVarsNew = Dau_DsdDecomposeTripleVarsInner( p, pTruth, pVars, nVars, v, uSupports );
                if ( nVarsNew == nVars )
                    continue;
                if ( nVarsNew == 0 )
                {
                    s_Times[2] += Abc_Clock() - clk;
                    return 0;
                }
                nVars = Dau_DsdDecomposeDoubleVars( p, pTruth, pVars, nVarsNew );
                if ( nVars == 0 )
                {
                    s_Times[2] += Abc_Clock() - clk;
                    return 0;
                }
                break;
            }
        }
        if ( v == -1 )
        {
            s_Times[2] += Abc_Clock() - clk;
            return nVars;
        }
    }
    assert( 0 );
    return -1;
}